

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::setChildProcessModifier(QProcess *this,function<void_()> *modifier)

{
  bool bVar1;
  QProcessPrivate *pQVar2;
  function<void_()> *in_RSI;
  QProcessPrivate *d;
  pointer in_stack_ffffffffffffffc8;
  UnixExtras *in_stack_ffffffffffffffd0;
  function<void_()> *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QProcess *)0x790f6c);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                      *)0x790f82);
  if (!bVar1) {
    in_stack_ffffffffffffffd8 = (function<void_()> *)&pQVar2->unixExtras;
    operator_new(0x40);
    QProcessPrivate::UnixExtras::UnixExtras(in_stack_ffffffffffffffd0);
    std::unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
    ::reset((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
             *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>::
  operator->((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
              *)0x790fd7);
  std::function<void_()>::operator=(in_stack_ffffffffffffffd8,in_RSI);
  return;
}

Assistant:

void QProcess::setChildProcessModifier(const std::function<void(void)> &modifier)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->childProcessModifier = modifier;
}